

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O2

gfield * __thiscall gfield::pow<13,13>(gfield *this,bigint<13> *x,bigint<13> *y)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  digit dVar4;
  digit dVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  gfield a;
  
  a.super_gfint.len = x->len;
  a.super_gfint.digits[0] = x->digits[0];
  a.super_gfint.digits[1] = x->digits[1];
  a.super_gfint.digits._18_8_ = *(undefined8 *)(x->digits + 9);
  a.super_gfint.digits._12_6_ = SUB86((ulong)*(undefined8 *)(x->digits + 5) >> 0x10,0);
  a.super_gfint.digits._4_6_ = SUB86(*(undefined8 *)(x->digits + 2),0);
  a.super_gfint.digits[5] = (digit)((ulong)*(undefined8 *)(x->digits + 2) >> 0x30);
  if ((y->len < 1) || ((y->digits[0] & 1) == 0)) {
    (this->super_gfint).len = 1;
    (this->super_gfint).digits[0] = 1;
    if (y->len == 0) {
      return this;
    }
  }
  else {
    iVar8 = x->len;
    dVar4 = x->digits[0];
    dVar5 = x->digits[1];
    uVar3 = *(undefined8 *)(x->digits + 2);
    uVar2 = *(undefined8 *)(x->digits + 6);
    uVar1 = *(undefined4 *)(x->digits + 10);
    (this->super_gfint).digits[0xc] = x->digits[0xc];
    *(undefined4 *)((this->super_gfint).digits + 10) = uVar1;
    *(undefined8 *)((this->super_gfint).digits + 6) = uVar2;
    (this->super_gfint).len = iVar8;
    (this->super_gfint).digits[0] = dVar4;
    (this->super_gfint).digits[1] = dVar5;
    *(undefined8 *)((this->super_gfint).digits + 2) = uVar3;
  }
  iVar7 = bigint<13>::numbits(y);
  for (iVar8 = 1; iVar8 < iVar7; iVar8 = iVar8 + 1) {
    square(&a);
    bVar6 = bigint<13>::hasbit(y,iVar8);
    if (bVar6) {
      mul<13>(this,&a.super_gfint);
    }
  }
  return this;
}

Assistant:

gfield &pow(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        gfield a(x);
        if(y.hasbit(0)) *this = a;
        else
        {
            len = 1;
            digits[0] = 1;
            if(!y.len) return *this;
        }
        for(int i = 1, j = y.numbits(); i < j; i++)
        {
            a.square();
            if(y.hasbit(i)) mul(a);
        }
        return *this;
    }